

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::M3DImporter::importTextures(M3DImporter *this,M3DWrapper *m3d)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  m3dtx_t *pmVar4;
  long *plVar5;
  long lVar6;
  Logger *this_00;
  aiTexture **ppaVar7;
  m3d_t *pmVar8;
  aiTexture *paVar9;
  long *plVar10;
  aiTexel *paVar11;
  ulong uVar12;
  uint uVar13;
  long *plVar14;
  uint8_t *puVar15;
  ulong uVar16;
  size_t __n;
  allocator<char> local_4a1;
  M3DImporter *local_4a0;
  long *local_498;
  ulong local_490;
  long local_488;
  long lStack_480;
  ulong local_478;
  M3DWrapper *local_470;
  m3dtx_t *local_468;
  long local_460;
  long *local_458 [2];
  long local_448 [2];
  undefined1 local_438 [1032];
  
  local_4a0 = this;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13c,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x13d,"void Assimp::M3DImporter::importTextures(const M3DWrapper &)");
  }
  this->mScene->mNumTextures = m3d->m3d_->numtexture;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[21]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
             (char (*) [21])"M3D: importTextures ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_438);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_498);
  if (local_498 != &local_488) {
    operator_delete(local_498,local_488 + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base((ios_base *)(local_438 + 0x70));
  uVar12 = (ulong)m3d->m3d_->numtexture;
  if (uVar12 != 0) {
    ppaVar7 = (aiTexture **)operator_new__(uVar12 << 3);
    local_4a0->mScene->mTextures = ppaVar7;
    pmVar8 = m3d->m3d_;
    if (pmVar8->numtexture != 0) {
      uVar12 = 0;
      local_470 = m3d;
      do {
        pmVar4 = pmVar8->texture;
        paVar9 = (aiTexture *)operator_new(0x428);
        paVar9->mWidth = 0;
        paVar9->mHeight = 0;
        paVar9->pcData = (aiTexel *)0x0;
        (paVar9->mFilename).length = 0;
        (paVar9->mFilename).data[0] = '\0';
        memset((paVar9->mFilename).data + 1,0x1b,0x3ff);
        paVar9->achFormatHint[0] = '\0';
        paVar9->achFormatHint[1] = '\0';
        paVar9->achFormatHint[2] = '\0';
        paVar9->achFormatHint[3] = '\0';
        local_460 = uVar12 * 3;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_458,pmVar4[uVar12].name,&local_4a1);
        plVar10 = (long *)std::__cxx11::string::append((char *)local_458);
        local_498 = &local_488;
        plVar14 = plVar10 + 2;
        if ((long *)*plVar10 == plVar14) {
          local_488 = *plVar14;
          lStack_480 = plVar10[3];
        }
        else {
          local_488 = *plVar14;
          local_498 = (long *)*plVar10;
        }
        plVar5 = local_498;
        local_490 = plVar10[1];
        *plVar10 = (long)plVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        __n = local_490 & 0xffffffff;
        if ((local_490 & 0xfffffc00) != 0) {
          __n = 0x3ff;
        }
        local_478 = uVar12;
        local_468 = pmVar4;
        memcpy(local_438 + 4,local_498,__n);
        local_438[__n + 4] = 0;
        (paVar9->mFilename).length = (ai_uint32)__n;
        memcpy((paVar9->mFilename).data,local_438 + 4,__n);
        (paVar9->mFilename).data[__n] = '\0';
        if (plVar5 != &local_488) {
          operator_delete(plVar5,local_488 + 1);
        }
        pmVar4 = local_468;
        if (local_458[0] != local_448) {
          operator_delete(local_458[0],local_448[0] + 1);
        }
        lVar6 = local_460;
        uVar2 = (&pmVar4->w)[local_460 * 4];
        if ((((uVar2 == 0) || ((&pmVar4->h)[local_460 * 4] == 0)) ||
            ((&pmVar4->f)[local_460 * 8] == '\0')) || ((&pmVar4->d)[local_460] == (uint8_t *)0x0)) {
          paVar9->mWidth = 0;
          paVar9->mHeight = 0;
          builtin_strncpy(paVar9->achFormatHint,"png",4);
          paVar9->pcData = (aiTexel *)0x0;
        }
        else {
          paVar9->mWidth = (uint)uVar2;
          uVar3 = (&pmVar4->h)[local_460 * 4];
          paVar9->mHeight = (uint)uVar3;
          strcpy(paVar9->achFormatHint,
                 &DAT_006c6148 +
                 *(int *)(m3d_commandtypes[0x25].a + (ulong)(&pmVar4->f)[local_460 * 8] * 4 + 6));
          paVar11 = (aiTexel *)operator_new__((ulong)((uint)uVar2 * (uint)uVar3) << 2);
          paVar9->pcData = paVar11;
          if (uVar3 != 0) {
            uVar12 = 0;
            uVar13 = 0;
            do {
              switch((&pmVar4->f)[lVar6 * 8]) {
              case '\x01':
                uVar16 = (ulong)uVar13;
                uVar13 = uVar13 + 1;
                paVar9->pcData[uVar12].g = (&pmVar4->d)[lVar6][uVar16];
                break;
              case '\x02':
                uVar1 = uVar13 + 1;
                paVar9->pcData[uVar12].g = (&pmVar4->d)[lVar6][uVar13];
                puVar15 = (&pmVar4->d)[lVar6];
                uVar13 = uVar13 + 2;
                goto LAB_0045cd41;
              case '\x03':
                paVar9->pcData[uVar12].r = (&pmVar4->d)[lVar6][uVar13];
                uVar1 = uVar13 + 2;
                paVar9->pcData[uVar12].g = (&pmVar4->d)[lVar6][uVar13 + 1];
                uVar13 = uVar13 + 3;
                paVar9->pcData[uVar12].b = (&pmVar4->d)[lVar6][uVar1];
                paVar9->pcData[uVar12].a = 0xff;
                break;
              case '\x04':
                paVar9->pcData[uVar12].r = (&pmVar4->d)[lVar6][uVar13];
                paVar9->pcData[uVar12].g = (&pmVar4->d)[lVar6][uVar13 + 1];
                uVar1 = uVar13 + 3;
                paVar9->pcData[uVar12].b = (&pmVar4->d)[lVar6][uVar13 + 2];
                puVar15 = (&pmVar4->d)[lVar6];
                uVar13 = uVar13 + 4;
LAB_0045cd41:
                paVar9->pcData[uVar12].a = puVar15[uVar1];
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < paVar9->mHeight * paVar9->mWidth);
          }
        }
        local_4a0->mScene->mTextures[local_478] = paVar9;
        uVar12 = local_478 + 1;
        pmVar8 = local_470->m3d_;
      } while (uVar12 < pmVar8->numtexture);
    }
  }
  return;
}

Assistant:

void M3DImporter::importTextures(const M3DWrapper &m3d) {
	unsigned int i;
	const char *formatHint[] = { "rgba0800", "rgba0808", "rgba8880", "rgba8888" };
	m3dtx_t *t;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	mScene->mNumTextures = m3d->numtexture;
	ASSIMP_LOG_DEBUG_F("M3D: importTextures ", mScene->mNumTextures);

	if (!m3d->numtexture)
		return;

	mScene->mTextures = new aiTexture *[m3d->numtexture];
	for (i = 0; i < m3d->numtexture; i++) {
		unsigned int j, k;
		t = &m3d->texture[i];
		aiTexture *tx = new aiTexture;
		tx->mFilename = aiString(std::string(t->name) + ".png");
		if (!t->w || !t->h || !t->f || !t->d) {
			/* without ASSIMP_USE_M3D_READFILECB, we only have the filename, but no texture data ever */
			tx->mWidth = 0;
			tx->mHeight = 0;
			memcpy(tx->achFormatHint, "png\000", 4);
			tx->pcData = nullptr;
		} else {
			/* if we have the texture loaded, set format hint and pcData too */
			tx->mWidth = t->w;
			tx->mHeight = t->h;
			strcpy(tx->achFormatHint, formatHint[t->f - 1]);
			tx->pcData = new aiTexel[tx->mWidth * tx->mHeight];
			for (j = k = 0; j < tx->mWidth * tx->mHeight; j++) {
				switch (t->f) {
					case 1: tx->pcData[j].g = t->d[k++]; break;
					case 2:
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
					case 3:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = 255;
						break;
					case 4:
						tx->pcData[j].r = t->d[k++];
						tx->pcData[j].g = t->d[k++];
						tx->pcData[j].b = t->d[k++];
						tx->pcData[j].a = t->d[k++];
						break;
				}
			}
		}
		mScene->mTextures[i] = tx;
	}
}